

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

output_record_t *
get_output_record(output_record_t *__return_storage_ptr__,size_t codepoint,unicode_record_t *ur,
                 derived_properties_t *core)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  output_record_t *poVar9;
  char buffer [9];
  
  __return_storage_ptr__->codepoint = codepoint;
  sVar1 = get_towupper(codepoint,ur);
  __return_storage_ptr__->toupper_diff = (int)sVar1 - (int)codepoint;
  sVar1 = get_towlower(codepoint,ur);
  __return_storage_ptr__->tolower_diff = (int)sVar1 - (int)codepoint;
  sVar1 = get_iswupper(codepoint,ur,core);
  sVar2 = get_iswlower(codepoint,ur,core);
  sVar3 = get_iswalpha(codepoint,ur,core);
  sVar4 = get_iswblank(codepoint,ur);
  sVar5 = get_iswspace(codepoint,ur);
  sVar6 = get_iswcntrl(codepoint,ur);
  sVar7 = get_iswprint(codepoint,ur);
  sVar8 = get_iswpunct(codepoint,ur,core);
  sprintf(buffer,"%zu%zu%zu%zu%zu%zu%zu%zu",sVar1,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7,sVar8);
  poVar9 = (output_record_t *)strtoul(buffer,(char **)0x0,2);
  __return_storage_ptr__->flags = (uchar)poVar9;
  return poVar9;
}

Assistant:

static struct output_record_t get_output_record( size_t codepoint, struct unicode_record_t * ur, struct derived_properties_t * core )
{
    struct output_record_t rc;
    char buffer[ 9 ];

    rc.codepoint = codepoint;
    rc.toupper_diff = get_towupper( codepoint, ur ) - codepoint;
    rc.tolower_diff = get_towlower( codepoint, ur ) - codepoint;

    sprintf( buffer, "%zu%zu%zu%zu%zu%zu%zu%zu",
             get_iswupper( codepoint, ur, core ),
             get_iswlower( codepoint, ur, core ),
             get_iswalpha( codepoint, ur, core ),
             get_iswblank( codepoint, ur ),
             get_iswspace( codepoint, ur ),
             get_iswcntrl( codepoint, ur ),
             get_iswprint( codepoint, ur ),
             get_iswpunct( codepoint, ur, core ) );

    rc.flags = strtoul( buffer, NULL, 2 );

    return rc;
}